

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_DoublingFactorCounterTest_AllTriplets_Test::~TEST_DoublingFactorCounterTest_AllTriplets_Test
          (TEST_DoublingFactorCounterTest_AllTriplets_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupDoublingFactorCounterTest_001d4d20;
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s.bonus_tiles._M_t);
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.melds);
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, true);
	addTriplet(Tile::TwoOfCircles, true);
	addTriplet(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(2, r.doubling_factor);
}